

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv__io_start(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uint events_local;
  uv__io_t *w_local;
  uv_loop_t *loop_local;
  
  if ((events & 0xffffdff8) != 0) {
    __assert_fail("0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x342,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (events == 0) {
    __assert_fail("0 != events",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x343,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (w->fd < 0) {
    __assert_fail("w->fd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x344,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (0x7ffffffe < w->fd) {
    __assert_fail("w->fd < INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/core.c"
                  ,0x345,"void uv__io_start(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  w->pevents = events | w->pevents;
  maybe_resize(loop,w->fd + 1);
  if (w->events != w->pevents) {
    if (w->watcher_queue == (void **)w->watcher_queue[0]) {
      w->watcher_queue[0] = loop->watcher_queue;
      w->watcher_queue[1] = loop->watcher_queue[1];
      *(void ***)w->watcher_queue[1] = w->watcher_queue;
      loop->watcher_queue[1] = w->watcher_queue;
    }
    if (loop->watchers[w->fd] == (uv__io_t *)0x0) {
      loop->watchers[w->fd] = w;
      loop->nfds = loop->nfds + 1;
    }
  }
  return;
}

Assistant:

void uv__io_start(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  assert(0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI)));
  assert(0 != events);
  assert(w->fd >= 0);
  assert(w->fd < INT_MAX);

  w->pevents |= events;
  maybe_resize(loop, w->fd + 1);

#if !defined(__sun)
  /* The event ports backend needs to rearm all file descriptors on each and
   * every tick of the event loop but the other backends allow us to
   * short-circuit here if the event mask is unchanged.
   */
  if (w->events == w->pevents)
    return;
#endif

  if (QUEUE_EMPTY(&w->watcher_queue))
    QUEUE_INSERT_TAIL(&loop->watcher_queue, &w->watcher_queue);

  if (loop->watchers[w->fd] == NULL) {
    loop->watchers[w->fd] = w;
    loop->nfds++;
  }
}